

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall
QList<QAbstractFileEngineHandler_*>::begin(QList<QAbstractFileEngineHandler_*> *this)

{
  QAbstractFileEngineHandler **n;
  QArrayDataPointer<QAbstractFileEngineHandler_*> *in_RDI;
  long in_FS_OFFSET;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<QAbstractFileEngineHandler_*> *)0x272b79);
  QArrayDataPointer<QAbstractFileEngineHandler_*>::operator->(in_RDI);
  n = QArrayDataPointer<QAbstractFileEngineHandler_*>::begin
                ((QArrayDataPointer<QAbstractFileEngineHandler_*> *)0x272b8a);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator begin() { detach(); return iterator(d->begin()); }